

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
calcu_in(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__return_storage_ptr__,int n,
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        *use,map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             *out,
        map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
        *def)

{
  _Base_ptr p_Var1;
  pointer pVVar2;
  pointer pVVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_b8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_98;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_80;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_68;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_50;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_38;
  
  p_Var5 = &(out->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = p_Var5;
  for (p_Var1 = (out->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < n]) {
    if (n <= (int)p_Var1[1]._M_color) {
      p_Var4 = p_Var1;
    }
  }
  if ((p_Var4 != p_Var5) && ((int)p_Var4[1]._M_color <= n)) {
    p_Var5 = p_Var4;
  }
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (&local_b8,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&p_Var5[1]._M_parent);
  p_Var5 = &(def->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = p_Var5;
  for (p_Var1 = (def->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < n]) {
    if (n <= (int)p_Var1[1]._M_color) {
      p_Var4 = p_Var1;
    }
  }
  if ((p_Var4 != p_Var5) && ((int)p_Var4[1]._M_color <= n)) {
    p_Var5 = p_Var4;
  }
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&local_38,&local_b8);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (&local_50,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&p_Var5[1]._M_parent);
  vectors_difference(&local_98,&local_38,&local_50);
  pVVar3 = local_b8.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pVVar2 = local_b8.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_98.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_98.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)pVVar3 - (long)pVVar2);
  }
  if (local_98.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  p_Var5 = &(use->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = p_Var5;
  for (p_Var1 = (use->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < n]) {
    if (n <= (int)p_Var1[1]._M_color) {
      p_Var4 = p_Var1;
    }
  }
  if ((p_Var4 != p_Var5) && ((int)p_Var4[1]._M_color <= n)) {
    p_Var5 = p_Var4;
  }
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&local_68,&local_b8);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            (&local_80,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&p_Var5[1]._M_parent);
  vectors_set_union(__return_storage_ptr__,&local_68,&local_80);
  if (local_80.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<mir::inst::VarId> calcu_in(int n, map<int, vector<mir::inst::VarId>> use,
                                  map<int, vector<mir::inst::VarId>> out,
                                  map<int, vector<mir::inst::VarId>> def) {
  // in[b] = use[b] U (out[b] - def[b])
  map<int, vector<mir::inst::VarId>>::iterator it;
  it = out.find(n);
  vector<mir::inst::VarId> v1 = it->second;
  it = def.find(n);
  v1 = vectors_difference(v1, it->second);
  it = use.find(n);
  return vectors_set_union(v1, it->second);
}